

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_is_hdr_from_file(FILE *f)

{
  long __off;
  undefined1 local_f8 [8];
  stbi__context s;
  int res;
  long pos;
  FILE *f_local;
  
  __off = ftell((FILE *)f);
  stbi__start_file((stbi__context *)local_f8,f);
  s.img_buffer_original_end._4_4_ = stbi__hdr_test((stbi__context *)local_f8);
  fseek((FILE *)f,__off,0);
  return s.img_buffer_original_end._4_4_;
}

Assistant:

STBIDEF int stbi_is_hdr_from_file(FILE *f)
{
   #ifndef STBI_NO_HDR
   long pos = ftell(f);
   int res;
   stbi__context s;
   stbi__start_file(&s,f);
   res = stbi__hdr_test(&s);
   fseek(f, pos, SEEK_SET);
   return res;
   #else
   STBI_NOTUSED(f);
   return 0;
   #endif
}